

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

size_t kj::anon_unknown_53::alignTo(size_t s,uint alignment)

{
  bool bVar1;
  size_t mask;
  Fault local_20;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint alignment_local;
  size_t s_local;
  
  f.exception._4_4_ = alignment;
  f.exception._2_1_ = isPowerOfTwo((ulong)alignment);
  f.exception._3_1_ =
       _::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena.c++"
               ,0x55,FAILED,"isPowerOfTwo(alignment)","_kjCondition,alignment",
               (DebugExpression<bool> *)((long)&f.exception + 3),(uint *)((long)&f.exception + 4));
    _::Debug::Fault::fatal(&local_20);
  }
  return s + (f.exception._4_4_ - 1) & ((ulong)(f.exception._4_4_ - 1) ^ 0xffffffffffffffff);
}

Assistant:

inline size_t alignTo(size_t s, uint alignment) {
  // Round the pointer up to the next aligned value.

  KJ_DASSERT(isPowerOfTwo(alignment), alignment);
  size_t mask = alignment - 1;
  return (s + mask) & ~mask;
}